

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O0

TestLog * __thiscall tcu::SampleBuilder::operator<<(SampleBuilder *this,EndSampleToken *param_1)

{
  TestLog *pTVar1;
  bool bVar2;
  pointer pVVar3;
  __normal_iterator<tcu::SampleBuilder::Value_*,_std::vector<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>_>
  local_30;
  __normal_iterator<tcu::SampleBuilder::Value_*,_std::vector<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>_>
  local_28;
  __normal_iterator<const_tcu::SampleBuilder::Value_*,_std::vector<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>_>
  local_20;
  const_iterator val;
  EndSampleToken *param_1_local;
  SampleBuilder *this_local;
  
  val._M_current = (Value *)param_1;
  TestLog::startSample(this->m_log);
  local_28._M_current =
       (Value *)std::vector<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>::
                begin(&this->m_values);
  __gnu_cxx::
  __normal_iterator<tcu::SampleBuilder::Value_const*,std::vector<tcu::SampleBuilder::Value,std::allocator<tcu::SampleBuilder::Value>>>
  ::__normal_iterator<tcu::SampleBuilder::Value*>
            ((__normal_iterator<tcu::SampleBuilder::Value_const*,std::vector<tcu::SampleBuilder::Value,std::allocator<tcu::SampleBuilder::Value>>>
              *)&local_20,&local_28);
  while( true ) {
    local_30._M_current =
         (Value *)std::vector<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>
                  ::end(&this->m_values);
    bVar2 = __gnu_cxx::operator!=(&local_20,&local_30);
    if (!bVar2) break;
    pVVar3 = __gnu_cxx::
             __normal_iterator<const_tcu::SampleBuilder::Value_*,_std::vector<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>_>
             ::operator->(&local_20);
    if (pVVar3->type == TYPE_FLOAT64) {
      pTVar1 = this->m_log;
      pVVar3 = __gnu_cxx::
               __normal_iterator<const_tcu::SampleBuilder::Value_*,_std::vector<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>_>
               ::operator->(&local_20);
      TestLog::writeSampleValue(pTVar1,(pVVar3->value).float64);
    }
    else {
      pVVar3 = __gnu_cxx::
               __normal_iterator<const_tcu::SampleBuilder::Value_*,_std::vector<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>_>
               ::operator->(&local_20);
      if (pVVar3->type == TYPE_INT64) {
        pTVar1 = this->m_log;
        pVVar3 = __gnu_cxx::
                 __normal_iterator<const_tcu::SampleBuilder::Value_*,_std::vector<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>_>
                 ::operator->(&local_20);
        TestLog::writeSampleValue(pTVar1,(pVVar3->value).int64);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_tcu::SampleBuilder::Value_*,_std::vector<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>_>
    ::operator++(&local_20);
  }
  TestLog::endSample(this->m_log);
  return this->m_log;
}

Assistant:

TestLog& SampleBuilder::operator<< (const TestLog::EndSampleToken&)
{
	m_log->startSample();

	for (std::vector<Value>::const_iterator val = m_values.begin(); val != m_values.end(); ++val)
	{
		if (val->type == Value::TYPE_FLOAT64)
			m_log->writeSampleValue(val->value.float64);
		else if (val->type == Value::TYPE_INT64)
			m_log->writeSampleValue(val->value.int64);
		else
			DE_ASSERT(false);
	}

	m_log->endSample();

	return *m_log;
}